

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O1

type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type word)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  qsbr_epoch local_31;
  
  uVar5 = (uint)((word & 0x3fffffff3fffffff) >> 0x20);
  uVar6 = (uint)(word & 0x3fffffff3fffffff);
  if (uVar6 <= uVar5) {
    if (uVar5 == 0) {
      __assert_fail("get_thread_count(word) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x144,
                    "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                   );
    }
    if (uVar6 == 0) {
      __assert_fail("get_threads_in_previous_epoch(word) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x145,
                    "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                   );
    }
    uVar2 = word - 0x100000001;
    uVar3 = (uint)((uVar2 & 0x3fffffff3fffffff) >> 0x20);
    uVar4 = (uint)(uVar2 & 0x3fffffff3fffffff);
    if (uVar4 <= uVar3) {
      bVar1 = detail::qsbr_epoch::operator==(&local_31,(qsbr_epoch)(epoch_type)(uVar2 >> 0x3e));
      if (!bVar1) {
        __assert_fail("get_epoch(word) == get_epoch(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x14a,
                      "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                     );
      }
      if (uVar6 - 1 == uVar4) {
        if (uVar5 - 1 == uVar3) {
          return uVar2;
        }
        __assert_fail("get_thread_count(word) - 1 == get_thread_count(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x14d,
                      "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                     );
      }
      __assert_fail("get_threads_in_previous_epoch(word) - 1 == get_threads_in_previous_epoch(result)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x14c,
                    "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                   );
    }
  }
  __assert_fail("threads_in_previous <= thread_count",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type
  dec_thread_count_and_threads_in_previous_epoch(type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_thread_count(word) > 0);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) > 0);

    const auto result = word - one_thread_and_one_in_previous;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) - 1 ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));

    return result;
  }